

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::ChConstraintThreeBBShaft
          (ChConstraintThreeBBShaft *this,ChConstraintThreeBBShaft *other)

{
  ChConstraintThree::ChConstraintThree
            (&this->super_ChConstraintThree,&other->super_ChConstraintThree);
  (this->super_ChConstraintThree).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_01187300;
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
            (&this->Cq_a,&other->Cq_a);
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
            (&this->Cq_b,&other->Cq_b);
  (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.m_data.array
  [0] = (other->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.m_data.
        array[0];
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            (&this->Eq_a,&other->Eq_a);
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            (&this->Eq_b,&other->Eq_b);
  (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (other->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
        array[0];
  return;
}

Assistant:

ChConstraintThreeBBShaft::ChConstraintThreeBBShaft(const ChConstraintThreeBBShaft& other) : ChConstraintThree(other) {
    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Cq_c = other.Cq_c;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;
    Eq_c = other.Eq_c;
}